

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O3

unique_ptr<llbuild::basic::ExecutionQueue,_std::default_delete<llbuild::basic::ExecutionQueue>_>
__thiscall
llbuild::buildsystem::BuildSystemFrontendDelegate::createExecutionQueue
          (BuildSystemFrontendDelegate *this)

{
  undefined4 uVar1;
  long lVar2;
  undefined4 *puVar3;
  QualityOfService qos;
  int numLanes;
  ExecutionQueue *pEVar4;
  long *in_RSI;
  BuildSystemInvocation invocation;
  char cStack_115;
  long *local_110 [2];
  long local_100 [2];
  long *local_f0 [2];
  long local_e0 [2];
  long *local_d0 [2];
  long local_c0 [2];
  long *local_b0 [2];
  long local_a0 [2];
  undefined8 local_90;
  undefined8 uStack_88;
  char **local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_78;
  undefined1 local_60;
  undefined8 local_58;
  undefined4 local_50;
  Twine local_48;
  
  lVar2 = in_RSI[6];
  puVar3 = *(undefined4 **)(*(long *)(lVar2 + 0x30) + 0x10);
  uVar1 = *puVar3;
  local_110[0] = local_100;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_110,*(long *)(puVar3 + 2),*(long *)(puVar3 + 4) + *(long *)(puVar3 + 2)
            );
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_f0,*(long *)(puVar3 + 10),
             *(long *)(puVar3 + 0xc) + *(long *)(puVar3 + 10));
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_d0,*(long *)(puVar3 + 0x12),
             *(long *)(puVar3 + 0x14) + *(long *)(puVar3 + 0x12));
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b0,*(long *)(puVar3 + 0x1a),
             *(long *)(puVar3 + 0x1c) + *(long *)(puVar3 + 0x1a));
  local_80 = *(char ***)(puVar3 + 0x26);
  local_90 = *(undefined8 *)(puVar3 + 0x22);
  uStack_88 = *(undefined8 *)(puVar3 + 0x24);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&vStack_78,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(puVar3 + 0x28));
  local_60 = *(undefined1 *)(puVar3 + 0x2e);
  if (uStack_88._4_1_ == '\x01') {
    qos = (QualityOfService)uStack_88;
  }
  else {
    qos = basic::getDefaultQualityOfService();
  }
  cStack_115 = (char)((uint)uVar1 >> 0x18);
  numLanes = 1;
  if ((cStack_115 == '\0') && (numLanes = local_90._4_4_, local_90._4_4_ == 0)) {
    numLanes = std::thread::hardware_concurrency();
    if (numLanes == 0) {
      local_58 = 0;
      local_50 = 0;
      llvm::Twine::Twine(&local_48,"unable to detect number of CPUs");
      (**(code **)(*in_RSI + 0x18))();
      numLanes = 1;
    }
  }
  pEVar4 = basic::createLaneBasedExecutionQueue
                     ((ExecutionQueueDelegate *)(lVar2 + 0x20),numLanes,(SchedulerAlgorithm)local_90
                      ,qos,local_80);
  (this->super_BuildSystemDelegate)._vptr_BuildSystemDelegate = (_func_int **)pEVar4;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_78);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0],local_c0[0] + 1);
  }
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0] + 1);
  }
  if (local_110[0] != local_100) {
    operator_delete(local_110[0],local_100[0] + 1);
  }
  return (__uniq_ptr_data<llbuild::basic::ExecutionQueue,_std::default_delete<llbuild::basic::ExecutionQueue>,_true,_true>
          )(__uniq_ptr_data<llbuild::basic::ExecutionQueue,_std::default_delete<llbuild::basic::ExecutionQueue>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<ExecutionQueue>
BuildSystemFrontendDelegate::createExecutionQueue() {
  auto impl = static_cast<BuildSystemFrontendDelegateImpl*>(this->impl);
  auto invocation = impl->frontend->invocation;
  QualityOfService qos = invocation.qos.hasValue() ?
      invocation.qos.getValue() : getDefaultQualityOfService();
  
  if (invocation.useSerialBuild) {
    return std::unique_ptr<ExecutionQueue>(
        createLaneBasedExecutionQueue(impl->executionQueueDelegate, 1,
                                      invocation.schedulerAlgorithm, qos,
                                      invocation.environment));
  }
    
  // Get the number of CPUs to use.
  unsigned numLanes = invocation.schedulerLanes;
  if (numLanes == 0) {
    unsigned numCPUs = std::thread::hardware_concurrency();
    if (numCPUs == 0) {
      error("<unknown>", {}, "unable to detect number of CPUs");
      numLanes = 1;
    } else {
      numLanes = numCPUs;
    }
  }
    
  return std::unique_ptr<ExecutionQueue>(
      createLaneBasedExecutionQueue(impl->executionQueueDelegate, numLanes,
                                    invocation.schedulerAlgorithm, qos,
                                    invocation.environment));
}